

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O2

vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
fasttext::FastText::getAnalogies
          (vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,FastText *this,int32_t k,string *wordA,string *wordB,
          string *wordC)

{
  Matrix *wordVectors;
  long lVar1;
  real rVar2;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_102;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_101;
  Vector buffer;
  Vector query;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70 [32];
  string local_50 [32];
  
  Vector::Vector(&query,(long)((this->args_).
                               super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                              )->dim);
  Vector::zero(&query);
  Vector::Vector(&buffer,(long)((this->args_).
                                super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->dim);
  getWordVector(this,&buffer,wordA);
  rVar2 = Vector::norm(&buffer);
  Vector::addVector(&query,&buffer,1.0 / (rVar2 + 1e-08));
  getWordVector(this,&buffer,wordB);
  rVar2 = Vector::norm(&buffer);
  Vector::addVector(&query,&buffer,-1.0 / (rVar2 + 1e-08));
  getWordVector(this,&buffer,wordC);
  rVar2 = Vector::norm(&buffer);
  Vector::addVector(&query,&buffer,1.0 / (rVar2 + 1e-08));
  lazyComputeWordVectors(this);
  wordVectors = (this->wordVectors_)._M_t.
                super___uniq_ptr_impl<fasttext::Matrix,_std::default_delete<fasttext::Matrix>_>._M_t
                .super__Tuple_impl<0UL,_fasttext::Matrix_*,_std::default_delete<fasttext::Matrix>_>.
                super__Head_base<0UL,_fasttext::Matrix_*,_false>._M_head_impl;
  if (wordVectors != (Matrix *)0x0) {
    std::__cxx11::string::string((string *)&local_90,(string *)wordA);
    std::__cxx11::string::string(local_70,(string *)wordB);
    std::__cxx11::string::string(local_50,(string *)wordC);
    __l._M_len = 3;
    __l._M_array = &local_90;
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&local_c0,__l,&local_101,&local_102);
    getNN(__return_storage_ptr__,this,wordVectors,&query,k,
          (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&local_c0);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_c0);
    lVar1 = 0x40;
    do {
      std::__cxx11::string::~string((string *)((long)&local_90._M_dataplus._M_p + lVar1));
      lVar1 = lVar1 + -0x20;
    } while (lVar1 != -0x20);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              ((_Vector_base<float,_std::allocator<float>_> *)&buffer);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              ((_Vector_base<float,_std::allocator<float>_> *)&query);
    return __return_storage_ptr__;
  }
  __assert_fail("wordVectors_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Whadup[P]weightedFastText/src/fasttext.cc"
                ,0x263,
                "std::vector<std::pair<real, std::string>> fasttext::FastText::getAnalogies(int32_t, const std::string &, const std::string &, const std::string &)"
               );
}

Assistant:

std::vector<std::pair<real, std::string>> FastText::getAnalogies(
		int32_t k,
		const std::string& wordA,
		const std::string& wordB,
		const std::string& wordC) {
	Vector query = Vector(args_->dim);
	query.zero();

	Vector buffer(args_->dim);
	getWordVector(buffer, wordA);
	query.addVector(buffer, 1.0 / (buffer.norm() + 1e-8));
	getWordVector(buffer, wordB);
	query.addVector(buffer, -1.0 / (buffer.norm() + 1e-8));
	getWordVector(buffer, wordC);
	query.addVector(buffer, 1.0 / (buffer.norm() + 1e-8));

	lazyComputeWordVectors();
	assert(wordVectors_);
	return getNN(*wordVectors_, query, k, {wordA, wordB, wordC});
}